

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcess::setStandardErrorFile(QProcess *this,QString *fileName,OpenMode mode)

{
  QObjectData *pQVar1;
  
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  QProcessPrivate::Channel::clear((Channel *)&pQVar1[6].children);
  QString::operator=((QString *)&pQVar1[6].children,fileName);
  *(char *)&pQVar1[6].bindingStorage.bindingStatus = ((fileName->d).size != 0) * '\x03';
  *(bool *)((long)&pQVar1[6].bindingStorage.bindingStatus + 2) =
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
       mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i ==
       (QFlagsStorage<QIODeviceBase::OpenModeFlag>)0x4;
  return;
}

Assistant:

void QProcess::setStandardErrorFile(const QString &fileName, OpenMode mode)
{
    Q_ASSERT(mode == Append || mode == Truncate);
    Q_D(QProcess);

    d->stderrChannel = fileName;
    d->stderrChannel.append = mode == Append;
}